

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wbmp.c
# Opt level: O0

void printwbmp(Wbmp *wbmp)

{
  int local_18;
  int local_14;
  int col;
  int row;
  Wbmp *wbmp_local;
  
  for (local_14 = 0; local_14 < wbmp->height; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < wbmp->width; local_18 = local_18 + 1) {
      if (wbmp->bitmap[wbmp->width * local_14 + local_18] == 0) {
        putchar(0x23);
      }
      else {
        putchar(0x20);
      }
    }
    putchar(10);
  }
  return;
}

Assistant:

void printwbmp(Wbmp *wbmp)
{
	int row, col;

	for(row = 0; row < wbmp->height; row++) {
		for(col = 0; col < wbmp->width; col++) {
			if(wbmp->bitmap[wbmp->width * row + col] == WBMP_BLACK) {
				putchar('#');
			} else {
				putchar(' ');
			}
		}
		putchar('\n');
	}
}